

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

void __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::check(basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *this)

{
  pointer ppVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  container *pcVar7;
  container *pcVar8;
  size_type sVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  ostringstream oss;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  pcVar7 = (this->list_).begin;
  if (pcVar7 == (container *)0x0) {
    sVar11 = 0;
  }
  else {
    ppVar1 = (this->hash_).
             super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar11 = 0;
    do {
      sVar2 = (pcVar7->val).first._M_string_length;
      if (sVar2 == 0) {
        uVar3 = 0;
      }
      else {
        sVar9 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 + (long)(pcVar7->val).first._M_dataplus._M_p[sVar9] * 0xac + 0xd;
          sVar9 = sVar9 + 1;
        } while (sVar2 != sVar9);
      }
      uVar3 = uVar3 % (ulong)((long)(this->hash_).
                                    super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4);
      if (ppVar1[uVar3].first != pcVar7 && ppVar1[uVar3].first == ppVar1[uVar3].second) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                   ,0x5b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x116);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," r.first==p",0xb);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_1c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      for (pcVar8 = ppVar1[uVar3].first; pcVar8 != ppVar1[uVar3].second; pcVar8 = pcVar8->next) {
        if (pcVar8 == pcVar7) goto LAB_00108d81;
      }
      if (pcVar8 != pcVar7) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                   ,0x5b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x121);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," p2 == p",8);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_1c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00108d81:
      if ((pcVar7->next == (container *)0x0) && (pcVar7 != (this->list_).end)) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                   ,0x5b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x123);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," p == list_.end",0xf);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_1c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sVar11 = sVar11 + 1;
      pcVar7 = pcVar7->next;
    } while (pcVar7 != (container *)0x0);
  }
  if (this->size_ != sVar11) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x126);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," size_ == count",0xf);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1c0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar1 = (this->hash_).
           super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(this->hash_).
                 super__Vector_base<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>,_std::allocator<std::pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*,_cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_hasher,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::container_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (lVar10 == 0) {
    sVar11 = 0;
  }
  else {
    uVar3 = lVar10 >> 4;
    uVar12 = 0;
    sVar11 = 0;
    do {
      for (pcVar7 = ppVar1[uVar12].first; pcVar7 != (container *)0x0;
          pcVar7 = *(container **)((long)pcVar7 + 0x30)) {
        sVar2 = *(size_type *)&((value_type *)((long)pcVar7 + 8))->first;
        if (sVar2 == 0) {
          uVar4 = 0;
        }
        else {
          sVar9 = 0;
          uVar4 = 0;
          do {
            uVar4 = uVar4 + (long)*(char *)(*(long *)pcVar7 + sVar9) * 0xac + 0xd;
            sVar9 = sVar9 + 1;
          } while (sVar2 != sVar9);
        }
        if (uVar4 % uVar3 != uVar12) {
          std::__cxx11::ostringstream::ostringstream(local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
                     ,0x5b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,300);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," h(p->val.first) % hash_.size() == i",0x24);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar6,local_1c0);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar11 = sVar11 + 1;
        if (pcVar7 == ppVar1[uVar12].second) break;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar3 + (uVar3 == 0));
  }
  if (this->size_ != sVar11) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/hash_map.h"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x131);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," size_ == count",0xf);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1c0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void check()
	{
		size_t count = 0;
		for(iterator p=list_.begin;p!=0;p=p->next,count++) {
			range_type &r = get(p->val.first);
			if(r.first == r.second) {
				TEST(r.first==p);
			}
			bool found = false;
			iterator p2;
			for(p2=r.first;p2!=r.second;p2=p2->next) {
				if(p2 == p) {
					found = true;
					break;
				}
			}
			if(!found)
				TEST(p2 == p);
			if(p->next == 0) {
				TEST(p == list_.end);
			}
		}
		TEST(size_ == count);
		count = 0;
		for(size_t i=0;i<hash_.size();i++) {
			for(iterator p=hash_[i].first;p;p=p->next) {
				count++;
				Hash h;
				TEST(h(p->val.first) % hash_.size() == i);
				if(p==hash_[i].second)
					break;
			}
		}
		TEST(size_ == count);
	}